

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O2

int i2d_RSAPrivateKey(RSA *a,uchar **out)

{
  int iVar1;
  CBB cbb;
  
  iVar1 = CBB_init(&cbb,0);
  if ((iVar1 != 0) && (iVar1 = RSA_marshal_private_key(&cbb,(RSA *)a), iVar1 != 0)) {
    iVar1 = CBB_finish_i2d(&cbb,out);
    return iVar1;
  }
  CBB_cleanup(&cbb);
  return -1;
}

Assistant:

int i2d_RSAPrivateKey(const RSA *in, uint8_t **outp) {
  CBB cbb;
  if (!CBB_init(&cbb, 0) ||
      !RSA_marshal_private_key(&cbb, in)) {
    CBB_cleanup(&cbb);
    return -1;
  }
  return CBB_finish_i2d(&cbb, outp);
}